

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTest::DeathTest(DeathTest *this)

{
  UnitTestImpl *this_00;
  TestInfo *this_01;
  undefined8 *in_RDI;
  TestInfo *info;
  string *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__DeathTest_00969458;
  this_00 = GetUnitTestImpl();
  this_01 = UnitTestImpl::current_test_info(this_00);
  if (this_01 == (TestInfo *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&this_01->test_suite_name_,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    DeathTestAbort(in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return;
}

Assistant:

DeathTest::DeathTest() {
  TestInfo* const info = GetUnitTestImpl()->current_test_info();
  if (info == nullptr) {
    DeathTestAbort("Cannot run a death test outside of a TEST or "
                   "TEST_F construct");
  }
}